

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_JavascriptEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  int iVar11;
  char *pcVar12;
  TemplateDictionaryPeer peer;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_1d8,"TestJavascriptEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_1d8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"easy JS");
  ctemplate::TemplateString::TemplateString(&local_b8,"joo");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  TVar6.length_ = local_b8.length_;
  TVar6.ptr_ = local_b8.ptr_;
  TVar6.is_immutable_ = local_b8.is_immutable_;
  TVar6._17_7_ = local_b8._17_7_;
  TVar6.id_ = local_b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar6,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"harder JS");
  ctemplate::TemplateString::TemplateString(&local_f8,"f = \'joo\';");
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  TVar7.length_ = local_f8.length_;
  TVar7.ptr_ = local_f8.ptr_;
  TVar7.is_immutable_ = local_f8.is_immutable_;
  TVar7._17_7_ = local_f8._17_7_;
  TVar7.id_ = local_f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar7,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_118,"hardest JS");
  ctemplate::TemplateString::TemplateString
            (&local_138,"f = \'foo\f\';\r\n\tprint \"\\&foo = \b\", \"foo\"");
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  TVar8.length_ = local_138.length_;
  TVar8.ptr_ = local_138.ptr_;
  TVar8.is_immutable_ = local_138.is_immutable_;
  TVar8._17_7_ = local_138._17_7_;
  TVar8.id_ = local_138.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar8,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_158,"close script JS");
  ctemplate::TemplateString::TemplateString(&local_178,"//--></script><script>alert(123);</script>")
  ;
  TVar4.length_ = local_158.length_;
  TVar4.ptr_ = local_158.ptr_;
  TVar4.is_immutable_ = local_158.is_immutable_;
  TVar4._17_7_ = local_158._17_7_;
  TVar4.id_ = local_158.id_;
  TVar9.length_ = local_178.length_;
  TVar9.ptr_ = local_178.ptr_;
  TVar9.is_immutable_ = local_178.is_immutable_;
  TVar9._17_7_ = local_178._17_7_;
  TVar9.id_ = local_178.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar9,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_198,"unicode codepoints");
  ctemplate::TemplateString::TemplateString(&local_1b8,anon_var_dwarf_4c28);
  TVar5.length_ = local_198.length_;
  TVar5.ptr_ = local_198.ptr_;
  TVar5.is_immutable_ = local_198.is_immutable_;
  TVar5._17_7_ = local_198._17_7_;
  TVar5.id_ = local_198.id_;
  TVar10.length_ = local_1b8.length_;
  TVar10.ptr_ = local_1b8.ptr_;
  TVar10.is_immutable_ = local_1b8.is_immutable_;
  TVar10._17_7_ = local_1b8._17_7_;
  TVar10.id_ = local_1b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar10,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_1d8,"easy JS");
  pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
  iVar11 = strcmp(pcVar12,"joo");
  if (iVar11 == 0) {
    ctemplate::TemplateString::TemplateString(&local_1d8,"harder JS");
    pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
    iVar11 = strcmp(pcVar12,"f \\x3d \\x27joo\\x27;");
    if (iVar11 == 0) {
      ctemplate::TemplateString::TemplateString(&local_1d8,"hardest JS");
      pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
      iVar11 = strcmp(pcVar12,
                      "f \\x3d \\x27foo\\f\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo \\x3d \\b\\x22, \\x22foo\\x22"
                     );
      if (iVar11 == 0) {
        ctemplate::TemplateString::TemplateString(&local_1d8,"close script JS");
        pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
        iVar11 = strcmp(pcVar12,
                        "//--\\x3e\\x3c/script\\x3e\\x3cscript\\x3ealert(123);\\x3c/script\\x3e");
        if (iVar11 == 0) {
          ctemplate::TemplateString::TemplateString(&local_1d8,"unicode codepoints");
          pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
          iVar11 = strcmp(pcVar12,anon_var_dwarf_4cb4);
          if (iVar11 == 0) {
            ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
            return;
          }
          pcVar12 = 
          "strcmp(peer.GetSectionValue(\"unicode codepoints\"), \"line1\" \"\\\\u2028\" \"line2\" \"\\\\u2029\" \"line3\" \"\\xe2\\x80\\xa7\" \"\\xe2\\x80\\xaa\" \"\\xe2\" \"\\\\u2028\" \"\\xe2\\x80\") == 0"
          ;
        }
        else {
          pcVar12 = 
          "strcmp(peer.GetSectionValue(\"close script JS\"), \"//--\\\\x3e\\\\x3c/script\\\\x3e\\\\x3cscript\\\\x3e\" \"alert(123);\\\\x3c/script\\\\x3e\") == 0"
          ;
        }
      }
      else {
        pcVar12 = 
        "strcmp(peer.GetSectionValue(\"hardest JS\"), \"f \\\\x3d \\\\x27foo\\\\f\\\\x27;\\\\r\\\\n\\\\tprint \\\\x22\\\\\\\\\\\\x26foo \" \"\\\\x3d \\\\b\\\\x22, \\\\x22foo\\\\x22\") == 0"
        ;
      }
    }
    else {
      pcVar12 = "strcmp(peer.GetSectionValue(\"harder JS\"), \"f \\\\x3d \\\\x27joo\\\\x27;\") == 0"
      ;
    }
  }
  else {
    pcVar12 = "strcmp(peer.GetSectionValue(\"easy JS\"), \"joo\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar12);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, JavascriptEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestJavascriptEscape", NULL);
  dict.SetEscapedValue("easy JS", "joo",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("harder JS", "f = 'joo';",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("hardest JS",
                       ("f = 'foo\f';\r\n\tprint \"\\&foo = \b\", \"foo\""),
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("close script JS",
                       "//--></script><script>alert(123);</script>",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("unicode codepoints",
                       ("line1" "\xe2\x80\xa8" "line2" "\xe2\x80\xa9" "line3"
                        /* \u2027 */ "\xe2\x80\xa7"
                        /* \u202A */ "\xe2\x80\xaa"
                        /* malformed */ "\xe2" "\xe2\x80\xa8"
                        /* truncated */ "\xe2\x80"),
                       GOOGLE_NAMESPACE::javascript_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy JS"), "joo");
  EXPECT_STREQ(peer.GetSectionValue("harder JS"), "f \\x3d \\x27joo\\x27;");
  EXPECT_STREQ(peer.GetSectionValue("hardest JS"),
               "f \\x3d \\x27foo\\f\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo "
               "\\x3d \\b\\x22, \\x22foo\\x22");
  EXPECT_STREQ(peer.GetSectionValue("close script JS"),
               "//--\\x3e\\x3c/script\\x3e\\x3cscript\\x3e"
               "alert(123);\\x3c/script\\x3e");
  EXPECT_STREQ(peer.GetSectionValue("unicode codepoints"),
               "line1" "\\u2028" "line2" "\\u2029" "line3"
               "\xe2\x80\xa7"
               "\xe2\x80\xaa"
               "\xe2" "\\u2028"
               "\xe2\x80");
}